

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall asmjit::CodeHolder::newLabelEntry(CodeHolder *this,LabelEntry **entryOut)

{
  size_type sVar1;
  Error EVar2;
  bool bVar3;
  LabelEntry *le;
  
  *entryOut = (LabelEntry *)0x0;
  sVar1 = (this->_labelEntries).super_ZoneVectorBase._size;
  if (sVar1 == 0xffffffff) {
    EVar2 = 0xd;
  }
  else {
    EVar2 = ZoneVector<asmjit::LabelEntry_*>::willGrow(&this->_labelEntries,&this->_allocator,1);
    if (EVar2 == 0) {
      le = (LabelEntry *)ZoneAllocator::allocZeroed(&this->_allocator,0x40);
      bVar3 = le != (LabelEntry *)0x0;
      if (bVar3) {
        *(size_type *)&le->field_0xc = sVar1;
        le->_parentId = 0xffffffff;
        le->_offset = 0;
        ZoneVector<asmjit::LabelEntry_*>::appendUnsafe(&this->_labelEntries,&le);
        *entryOut = le;
      }
      EVar2 = (Error)!bVar3;
    }
  }
  return EVar2;
}

Assistant:

Error CodeHolder::newLabelEntry(LabelEntry** entryOut) noexcept {
  *entryOut = nullptr;

  uint32_t labelId = _labelEntries.size();
  if (ASMJIT_UNLIKELY(labelId == Globals::kInvalidId))
    return DebugUtils::errored(kErrorTooManyLabels);

  ASMJIT_PROPAGATE(_labelEntries.willGrow(&_allocator));
  LabelEntry* le = _allocator.allocZeroedT<LabelEntry>();

  if (ASMJIT_UNLIKELY(!le))
    return DebugUtils::errored(kErrorOutOfMemory);

  le->_setId(labelId);
  le->_parentId = Globals::kInvalidId;
  le->_offset = 0;
  _labelEntries.appendUnsafe(le);

  *entryOut = le;
  return kErrorOk;
}